

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O1

void __thiscall
de::details::
UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
::reset(UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
        *this)

{
  Pipeline *this_00;
  ProgramWrapper *pPVar1;
  
  this_00 = (this->m_data).ptr;
  if (this_00 != (Pipeline *)0x0) {
    pPVar1 = (this_00->frgProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
    if (pPVar1 != (ProgramWrapper *)0x0) {
      (*pPVar1->_vptr_ProgramWrapper[1])();
      (this_00->frgProg).
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
      .m_data.ptr = (ProgramWrapper *)0x0;
    }
    pPVar1 = (this_00->vtxProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
    if (pPVar1 != (ProgramWrapper *)0x0) {
      (*pPVar1->_vptr_ProgramWrapper[1])();
      (this_00->vtxProg).
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
      .m_data.ptr = (ProgramWrapper *)0x0;
    }
    pPVar1 = (this_00->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
    if (pPVar1 != (ProgramWrapper *)0x0) {
      (*pPVar1->_vptr_ProgramWrapper[1])();
      (this_00->fullProg).
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
      .m_data.ptr = (ProgramWrapper *)0x0;
    }
    UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::reset
              ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> *)
               this_00);
    operator_delete(this_00,0x40);
    (this->m_data).ptr = (Pipeline *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}